

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_urbg.cc
# Opt level: O1

result_type absl::lts_20240722::random_internal::RandenPool<unsigned_char>::Generate(void)

{
  SpinLock *pSVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint uVar5;
  RandenPoolEntry *pRVar6;
  
  pRVar6 = anon_unknown_0::GetPoolForCurrentThread();
  pSVar1 = &pRVar6->mu_;
  uVar5 = (pRVar6->mu_).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar5 & 1) == 0) {
    LOCK();
    uVar2 = (pSVar1->lockword_).super___atomic_base<unsigned_int>._M_i;
    if (uVar5 == uVar2) {
      (pSVar1->lockword_).super___atomic_base<unsigned_int>._M_i = uVar5 | 1;
      uVar2 = uVar5;
    }
    uVar5 = uVar2;
    UNLOCK();
  }
  if ((uVar5 & 1) != 0) {
    absl::lts_20240722::base_internal::SpinLock::SlowLock();
  }
  if (0x3f < pRVar6->next_) {
    pRVar6->next_ = 4;
    if (pRVar6->field_0x110 == '\x01') {
      absl::lts_20240722::random_internal::RandenHwAes::Generate(*(void **)&pRVar6->impl_,pRVar6);
    }
    else {
      absl::lts_20240722::random_internal::RandenSlow::Generate(*(void **)&pRVar6->impl_,pRVar6);
    }
  }
  sVar4 = pRVar6->next_;
  pRVar6->next_ = sVar4 + 1;
  uVar3 = pRVar6->state_[sVar4];
  LOCK();
  uVar5 = (pSVar1->lockword_).super___atomic_base<unsigned_int>._M_i;
  (pSVar1->lockword_).super___atomic_base<unsigned_int>._M_i =
       (pSVar1->lockword_).super___atomic_base<unsigned_int>._M_i & 2;
  UNLOCK();
  if (7 < uVar5) {
    absl::lts_20240722::base_internal::SpinLock::SlowUnlock((uint)pSVar1);
  }
  return (result_type)uVar3;
}

Assistant:

typename RandenPool<T>::result_type RandenPool<T>::Generate() {
  auto* pool = GetPoolForCurrentThread();
  return pool->Generate<T>();
}